

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O2

void __thiscall
TRM::line_bresenham_interpolator::line_bresenham_interpolator
          (line_bresenham_interpolator *this,int x1,int y1,int x2,int y2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  this->m_x1_lr = x1 >> 8;
  this->m_y1_lr = y1 >> 8;
  this->m_x2_lr = x2 >> 8;
  uVar3 = (x2 >> 8) - (x1 >> 8);
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  this->m_y2_lr = y2 >> 8;
  uVar4 = (y2 >> 8) - (y1 >> 8);
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  bVar5 = uVar2 < uVar3;
  this->m_ver = bVar5;
  if (uVar3 < uVar2) {
    uVar3 = uVar2;
  }
  this->m_len = uVar3;
  bVar1 = x1 < x2;
  if (bVar5) {
    bVar1 = y1 < y2;
  }
  this->m_inc = (uint)bVar1 * 2 + -1;
  if (bVar5) {
    y2 = x2;
    y1 = x1;
  }
  dda2_line_interpolator::dda2_line_interpolator(&this->m_interpolator,y1,y2,uVar3);
  return;
}

Assistant:

explicit line_bresenham_interpolator(int x1, int y1, int x2, int y2)
      : m_x1_lr(line_lr(x1)),
        m_y1_lr(line_lr(y1)),
        m_x2_lr(line_lr(x2)),
        m_y2_lr(line_lr(y2)),
        m_ver(std::abs(m_x2_lr - m_x1_lr) < std::abs(m_y2_lr - m_y1_lr)),
        m_len(m_ver ? std::abs(m_y2_lr - m_y1_lr)
                    : std::abs(m_x2_lr - m_x1_lr)),
        m_inc(m_ver ? ((y2 > y1) ? 1 : -1) : ((x2 > x1) ? 1 : -1)),
        m_interpolator(m_ver ? x1 : y1, m_ver ? x2 : y2, m_len) {}